

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.cpp
# Opt level: O1

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* pstore::command_line::csv
            (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *s)

{
  size_t *psVar1;
  ulong uVar2;
  _List_node_base *p_Var3;
  ulong uVar4;
  _List_node_base *local_50;
  _List_node_base *local_48;
  _List_node_base local_40;
  
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  uVar4 = 0;
  do {
    uVar2 = std::__cxx11::string::find((char)s,0x2c);
    if (uVar2 < uVar4) {
      assert_failed("epos >= spos",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/csv.cpp"
                    ,0x19);
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)s);
    p_Var3 = (_List_node_base *)operator_new(0x30);
    p_Var3[1]._M_next = p_Var3 + 2;
    if (local_50 == &local_40) {
      p_Var3[2]._M_next = (_List_node_base *)CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_)
      ;
      p_Var3[2]._M_prev = local_40._M_prev;
    }
    else {
      p_Var3[1]._M_next = local_50;
      p_Var3[2]._M_next = (_List_node_base *)CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_)
      ;
    }
    p_Var3[1]._M_prev = local_48;
    local_48 = (_List_node_base *)0x0;
    local_40._M_next._0_1_ = 0;
    local_50 = &local_40;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(__return_storage_ptr__->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_) + 1);
    }
    uVar4 = uVar2 + 1;
    if (uVar4 == 0) {
      uVar4 = 0xffffffffffffffff;
    }
  } while (uVar4 != 0xffffffffffffffff);
  return __return_storage_ptr__;
}

Assistant:

std::list<std::string> pstore::command_line::csv (std::string const & s) {
    std::list<std::string> result;
    auto spos = std::string::size_type{0};
    while (spos != std::string::npos) {
        auto const epos = s.find (',', spos);
        PSTORE_ASSERT (epos >= spos);
        result.emplace_back (s.substr (spos, epos - spos));
        spos = (epos == std::string::npos) ? epos : epos + 1;
    }
    return result;
}